

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DumpToString(TemplateDictionary *this,string *out,int indent)

{
  DictionaryPrinter printer;
  IndentedWriter local_20;
  
  local_20.line_state_ = AT_BEGINNING;
  local_20.out_ = out;
  local_20.current_indentation_ = indent;
  local_20.original_indentation_ = indent;
  DictionaryPrinter::DumpToString((DictionaryPrinter *)&local_20,this);
  IndentedWriter::~IndentedWriter(&local_20);
  return;
}

Assistant:

void TemplateDictionary::DumpToString(string* out, int indent) const {
  DictionaryPrinter printer(out, indent);
  printer.DumpToString(*this);
}